

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply.hpp
# Opt level: O0

tuple<unsigned_long,_unsigned_long,_unsigned_long> *
qclab::qgates::masks
          (tuple<unsigned_long,_unsigned_long,_unsigned_long> *__return_storage_ptr__,int nbQubits,
          int qubit0,int qubit1)

{
  byte bVar1;
  unsigned_long local_40;
  uint64_t mR;
  uint64_t mC;
  uint64_t mL;
  int nR;
  int nC;
  int nL;
  int qubit1_local;
  int qubit0_local;
  int nbQubits_local;
  
  nC = qubit1;
  nL = qubit0;
  qubit1_local = nbQubits;
  _qubit0_local = __return_storage_ptr__;
  if (nbQubits < 2) {
    __assert_fail("nbQubits >= 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/src/qgates/apply.hpp"
                  ,0xf5,
                  "std::tuple<uint64_t, uint64_t, uint64_t> qclab::qgates::masks(const int, const int, const int)"
                 );
  }
  if (qubit0 < nbQubits) {
    if (qubit1 < nbQubits) {
      mL._4_4_ = (qubit1 - qubit0) + -1;
      mL._0_4_ = (nbQubits - qubit1) + -1;
      bVar1 = (byte)(int)mL;
      mC = (1L << ((byte)qubit0 & 0x3f)) + -1 << (bVar1 + (byte)mL._4_4_ & 0x3f);
      mR = (1L << ((byte)mL._4_4_ & 0x3f)) + -1 << (bVar1 & 0x3f);
      local_40 = (1L << (bVar1 & 0x3f)) - 1;
      nR = qubit0;
      std::tuple<unsigned_long,_unsigned_long,_unsigned_long>::tuple<true,_true>
                (__return_storage_ptr__,&mC,&mR,&local_40);
      return __return_storage_ptr__;
    }
    __assert_fail("qubit1 < nbQubits",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/src/qgates/apply.hpp"
                  ,0xf6,
                  "std::tuple<uint64_t, uint64_t, uint64_t> qclab::qgates::masks(const int, const int, const int)"
                 );
  }
  __assert_fail("qubit0 < nbQubits",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/src/qgates/apply.hpp"
                ,0xf6,
                "std::tuple<uint64_t, uint64_t, uint64_t> qclab::qgates::masks(const int, const int, const int)"
               );
}

Assistant:

inline
  std::tuple< uint64_t , uint64_t , uint64_t > masks( const int nbQubits ,
                                                      const int qubit0 ,
                                                      const int qubit1 ) {
    assert( nbQubits >= 2 ) ;
    assert( qubit0 < nbQubits ) ; assert( qubit1 < nbQubits ) ;
    // mask lengths
    const int nL = qubit0 ;
    const int nC = qubit1 - qubit0 - 1 ;
    const int nR = nbQubits - qubit1 - 1 ;
    // masks
    const uint64_t mL = ( ( 1ULL << nL ) - 1 ) << ( nR + nC ) ;
    const uint64_t mC = ( ( 1ULL << nC ) - 1 ) <<   nR ;
    const uint64_t mR =   ( 1ULL << nR ) - 1 ;
    return { mL , mC , mR } ;
  }